

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O3

Instr * Peeps::RemoveDeadBlock(Instr *instr,bool *wasStmtBoundaryKeptInDeadBlock)

{
  IRKind IVar1;
  Instr *pIVar2;
  Instr *this;
  byte bVar3;
  Instr *this_00;
  bool bVar4;
  
  bVar3 = 1;
  if (instr == (Instr *)0x0) {
    instr = (Instr *)0x0;
    bVar4 = false;
  }
  else {
    this_00 = (Instr *)0x0;
    do {
      IVar1 = instr->m_kind;
      if ((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) {
        bVar3 = (*(byte *)&instr[1].m_func & 2) >> 1;
        bVar4 = this_00 != (Instr *)0x0;
        if (bVar4 && bVar3 == 0) {
          IR::Instr::Unlink(this_00);
          IR::Instr::InsertAfter(instr,this_00);
          bVar3 = 0;
        }
        goto LAB_0061de49;
      }
      if (IVar1 == InstrKindExit) goto LAB_0061de06;
      pIVar2 = instr->m_next;
      this = instr;
      if (((IVar1 != InstrKindPragma) || (instr->m_opcode != StatementBoundary)) ||
         (bVar4 = this_00 != (Instr *)0x0, this = this_00, this_00 = instr, bVar4)) {
        IR::Instr::Remove(this);
      }
      instr = pIVar2;
    } while (pIVar2 != (Instr *)0x0);
    instr = (Instr *)0x0;
LAB_0061de06:
    bVar4 = this_00 != (Instr *)0x0;
  }
LAB_0061de49:
  if (wasStmtBoundaryKeptInDeadBlock != (bool *)0x0) {
    *wasStmtBoundaryKeptInDeadBlock = (bool)(bVar4 & bVar3);
  }
  return instr;
}

Assistant:

IR::Instr *Peeps::RemoveDeadBlock(IR::Instr *instr, bool* wasStmtBoundaryKeptInDeadBlock /* = nullptr */)
{
    IR::Instr* lastStatementBoundary = nullptr;

    while (instr && !instr->IsLabelInstr() && !instr->IsExitInstr())
    {
        IR::Instr *deadInstr = instr;
        instr = instr->m_next;

        if (deadInstr->IsPragmaInstr() && deadInstr->m_opcode == Js::OpCode::StatementBoundary)
        {
            if (lastStatementBoundary)
            {
                //Its enough if we keep latest statement boundary. Rest are dead anyway.
                lastStatementBoundary->Remove();
            }
            lastStatementBoundary = deadInstr;
        }
        else
        {
            deadInstr->Remove();
        }
    }

    // Do not let StatementBoundary to move across non-helper and helper blocks, very important under debugger:
    // if we let that happen, helper block can be moved to the end of the func so that statement maps will miss one statement.
    // Issues can be when (normally, StatementBoundary should never belong to a helper label):
    // - if we remove the label and prev label is a helper, StatementBoundary will be moved inside helper.
    // - if we move StatementBoundary under next label which is a helper, same problem again.
    bool canMoveStatementBoundaryUnderNextLabel = instr && instr->IsLabelInstr() && !instr->AsLabelInstr()->isOpHelper;

    if (lastStatementBoundary && canMoveStatementBoundaryUnderNextLabel)
    {
        lastStatementBoundary->Unlink();
        instr->InsertAfter(lastStatementBoundary);
    }

    if (wasStmtBoundaryKeptInDeadBlock)
    {
        *wasStmtBoundaryKeptInDeadBlock = lastStatementBoundary && !canMoveStatementBoundaryUnderNextLabel;
    }

    return instr;
}